

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  application application;
  application local_1d0;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Autonomous Cabs Backend\n",0x18);
  ::application::application(&local_1d0);
  iVar1 = ::application::run(&local_1d0,argc,argv);
  ::application::~application(&local_1d0);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    std::cout << "Autonomous Cabs Backend\n";

    int return_value = 0;

    try
    {
        application application;
        return_value = application.run(argc, argv);
    }
    catch(std::exception& e)
    {
        std::cerr << "Critital error\n" << e.what() << std::endl;
        std::cerr << "Program terminated" << std::endl;

        return_value = -1;
    }

    return return_value;
}